

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  LRUHandle *pLVar1;
  int iVar2;
  size_t in_RCX;
  undefined4 in_register_00000014;
  uint in_R8D;
  LRUHandle **ppLVar3;
  
  ppLVar3 = (LRUHandle **)(&key->data_ + ((int)this - 1U & in_R8D));
  pLVar1 = *ppLVar3;
  do {
    if (pLVar1 == (LRUHandle *)0x0) {
      return ppLVar3;
    }
    if (pLVar1->hash == in_R8D) {
      if (pLVar1->next == pLVar1) {
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      if ((pLVar1->key_length == in_RCX) &&
         (iVar2 = bcmp((void *)CONCAT44(in_register_00000014,hash),pLVar1->key_data,in_RCX),
         iVar2 == 0)) {
        return ppLVar3;
      }
    }
    ppLVar3 = &pLVar1->next_hash;
    pLVar1 = pLVar1->next_hash;
  } while( true );
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }